

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O2

uint8_t Show_bmp(uint32_t x,uint32_t y,char *path)

{
  byte bVar1;
  uint32_t uVar2;
  FILE *__stream;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  FILE *pFVar10;
  char *__s;
  uint8_t *puVar11;
  long lVar12;
  uint8_t *puVar13;
  ulong uVar14;
  uint32_t uVar15;
  FILE *pFVar16;
  uint uVar17;
  uint8_t *puVar18;
  ulong uVar19;
  byte *pbVar20;
  byte *pbVar21;
  uint8_t *local_d0;
  uint32_t local_bc;
  uint8_t *local_a8;
  BITMAPINFOHEADER InfoHead;
  BITMAPFILEHEADER FileHead;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    return 0xff;
  }
  sVar3 = fread(&FileHead,0xe,1,__stream);
  if ((int)sVar3 != 1) {
    puts("Read header error!");
    fclose(__stream);
    return 0xfe;
  }
  if (FileHead.cfType != 0x4d42) {
    puts("It\'s not a BMP file");
    fclose(__stream);
    return 0xfd;
  }
  puts("\n*****************************************");
  printf("BMP_cfSize:%d \n",(ulong)FileHead.cfSize);
  printf("BMP_cfoffBits:%d \n",(ulong)FileHead.cfoffBits);
  sVar3 = fread(&InfoHead,0x28,1,__stream);
  if ((int)sVar3 != 1) {
    puts("Read infoheader error!");
    fclose(__stream);
    return 0xfc;
  }
  printf("BMP_ciSize:%d \n",(ulong)InfoHead.ciSize);
  uVar15 = InfoHead.ciWidth;
  printf("BMP_ciWidth:%d \n",(ulong)InfoHead.ciWidth);
  uVar2 = InfoHead.ciHeight;
  printf("BMP_ciHeight:%d \n",(ulong)InfoHead.ciHeight);
  printf("BMP_ciPlanes:%x \n",(ulong)InfoHead.ciPlanes);
  printf("BMP_ciBitCount:%x \n",(ulong)InfoHead.ciBitCount);
  printf("BMP_ciCompress:%x \n",(ulong)InfoHead.ciCompress);
  printf("BMP_ciSizeImage:%x \n",(ulong)InfoHead.ciSizeImage);
  printf("BMP_ciXPelsPerMeter:%x \n",(ulong)InfoHead.ciXPelsPerMeter);
  printf("BMP_ciYPelsPerMeter:%x \n",(ulong)InfoHead.ciYPelsPerMeter);
  printf("BMP_ciClrUsed:%x \n",(ulong)InfoHead.ciClrUsed);
  printf("BMP_ciClrImportant:%x \n",(ulong)InfoHead.ciClrImportant);
  puts("*****************************************\n");
  sVar3 = (size_t)(FileHead.cfSize - FileHead.cfoffBits);
  bytesPerLine = uVar15 * InfoHead.ciBitCount + 0x1f >> 3 & 0xfffffffc;
  imageSize = bytesPerLine * uVar2;
  skip = -(uVar15 * InfoHead.ciBitCount >> 3) & 3;
  printf("total_length:%d,%d\n",(ulong)InfoHead.ciSizeImage,sVar3);
  printf("bytesPerLine = %d\n",(ulong)bytesPerLine);
  printf("imageSize = %d\n",(ulong)imageSize);
  printf("skip = %d\n",(ulong)skip);
  bmp_width = uVar15;
  bmp_height = uVar2;
  bmp_BitCount = (uint8_t)InfoHead.ciBitCount;
  bmp_src_buf = (uint8_t *)calloc(1,sVar3);
  if ((bmp_src_buf != (uint8_t *)0x0) &&
     (bmp_dst_buf = (uint8_t *)calloc(1,sVar3), bmp_dst_buf != (uint8_t *)0x0)) {
    fseek(__stream,(ulong)FileHead.cfoffBits,0);
    puVar18 = bmp_src_buf;
    do {
      while( true ) {
        sVar4 = fread(puVar18,1,sVar3,__stream);
        if ((int)sVar4 != 0) break;
        usleep(100);
      }
      puVar18 = puVar18 + (sVar4 & 0xffffffff);
      uVar17 = (int)sVar3 - (int)sVar4;
      sVar3 = (size_t)uVar17;
    } while (uVar17 != 0);
    if (bmp_BitCount == '\b') {
      fseek(__stream,0x36,0);
      sVar4 = fread(palette,1,0x400,__stream);
      if ((int)sVar4 == 0x400) goto LAB_00104386;
      __s = "Error: fread != 1024";
      goto LAB_00104340;
    }
    if (bmp_BitCount == '\x04') {
      fseek(__stream,0x36,0);
      sVar4 = fread(palette,1,0x40,__stream);
      if ((int)sVar4 != 0x40) {
        __s = "Error: fread != 64";
        goto LAB_00104340;
      }
    }
    else {
      if (bmp_BitCount != '\x01') goto LAB_00104386;
      fseek(__stream,0x36,0);
      sVar4 = fread(palette,1,8,__stream);
      if ((int)sVar4 != 8) {
        __s = "Error: fread != 8";
        goto LAB_00104340;
      }
    }
    bmp_dst_buf = (uint8_t *)calloc(1,(ulong)(uVar2 * uVar15));
    if (bmp_dst_buf != (uint8_t *)0x0) {
LAB_00104386:
      puVar18 = bmp_src_buf;
      pFVar10 = __stream;
      if (bmp_BitCount == ' ') {
        puVar11 = bmp_dst_buf + bmp_width * bmp_height * 4;
        uVar17 = 0;
        iVar7 = 4;
        uVar15 = bmp_width;
        while (uVar17 < bmp_height) {
          uVar17 = uVar17 + 1;
          puVar13 = puVar18 + ((ulong)(uVar15 * iVar7) - 1);
          for (uVar9 = 0; uVar9 < uVar15; uVar9 = uVar9 + 1) {
            puVar11[-4] = puVar13[-1];
            puVar11[-3] = puVar13[-2];
            puVar11[-2] = puVar13[-3];
            puVar11[-1] = *puVar13;
            puVar11 = puVar11 + -4;
            puVar13 = puVar13 + -4;
            uVar15 = bmp_width;
          }
          iVar7 = iVar7 + 4;
        }
      }
      else if (bmp_BitCount == '\x04') {
        pbVar21 = bmp_dst_buf + bmp_height * bmp_width;
        uVar15 = bmp_width;
        for (uVar17 = 0; uVar17 < bmp_height; uVar17 = uVar17 + 1) {
          uVar14 = 0;
          uVar9 = 0;
          pbVar20 = pbVar21 + (1 - (ulong)uVar15);
          do {
            pbVar21 = pbVar20;
            if (uVar15 + 1 >> 1 <= uVar14) {
              pbVar21 = pbVar21 + -1;
              goto LAB_0010467c;
            }
            bVar1 = puVar18[uVar14];
            pbVar21[-1] = bVar1 >> 4;
            if (uVar9 + 1 == bmp_width) {
              uVar15 = uVar9 | 1;
              goto LAB_0010467c;
            }
            *pbVar21 = bVar1 & 0xf;
            uVar9 = uVar9 + 2;
            uVar14 = uVar14 + 1;
            pbVar20 = pbVar21 + 2;
            uVar15 = bmp_width;
          } while (uVar9 != bmp_width);
          pbVar21 = pbVar21 + 1;
          uVar15 = uVar9;
LAB_0010467c:
          pbVar21 = pbVar21 + -(ulong)uVar15;
          puVar18 = puVar18 + bytesPerLine;
        }
      }
      else if (bmp_BitCount == '\b') {
        puVar11 = bmp_dst_buf + bmp_height * bmp_width;
        uVar17 = 0;
        iVar7 = 1;
        uVar15 = bmp_width;
        while (uVar17 < bmp_height) {
          uVar17 = uVar17 + 1;
          uVar14 = (ulong)skip;
          uVar9 = bytesPerLine * iVar7;
          lVar12 = -1;
          for (lVar5 = 0; (uint)lVar5 < uVar15; lVar5 = lVar5 + 1) {
            puVar11[lVar12] = puVar18[lVar12 + (uVar9 - uVar14)];
            lVar12 = lVar12 + -1;
            uVar15 = bmp_width;
          }
          puVar11 = puVar11 + -lVar5;
          iVar7 = iVar7 + 1;
        }
      }
      else if (bmp_BitCount == '\x10') {
        puVar11 = bmp_dst_buf + bmp_width * bmp_height * 2;
        uVar17 = 0;
        iVar7 = 1;
        uVar15 = bmp_width;
        while (uVar17 < bmp_height) {
          uVar17 = uVar17 + 1;
          puVar13 = puVar18 + ((ulong)(bytesPerLine * iVar7) - (ulong)skip) + -1;
          for (uVar9 = 0; uVar9 < uVar15; uVar9 = uVar9 + 1) {
            puVar11[-2] = *puVar13;
            puVar11[-1] = puVar13[-1];
            puVar11 = puVar11 + -2;
            puVar13 = puVar13 + -2;
            uVar15 = bmp_width;
          }
          iVar7 = iVar7 + 1;
        }
      }
      else if (bmp_BitCount == '\x18') {
        puVar11 = bmp_dst_buf + bmp_width * bmp_height * 3;
        uVar17 = 0;
        iVar7 = 1;
        uVar15 = bmp_width;
        while (uVar17 < bmp_height) {
          uVar17 = uVar17 + 1;
          puVar13 = puVar18 + ((ulong)(bytesPerLine * iVar7) - (ulong)skip) + -1;
          for (uVar9 = 0; uVar9 < uVar15; uVar9 = uVar9 + 1) {
            puVar11[-3] = *puVar13;
            puVar11[-2] = puVar13[-1];
            puVar11[-1] = puVar13[-2];
            puVar11 = puVar11 + -3;
            puVar13 = puVar13 + -3;
            uVar15 = bmp_width;
          }
          iVar7 = iVar7 + 1;
        }
      }
      else if (bmp_BitCount == '\x01') {
        puVar11 = bmp_dst_buf + bmp_height * bmp_width;
        uVar15 = bmp_width;
        for (uVar17 = 0; uVar17 < bmp_height; uVar17 = uVar17 + 1) {
          lVar12 = (long)puVar11 - (ulong)uVar15;
          pFVar16 = (FILE *)0x0;
          for (uVar14 = 0; uVar14 < uVar15 + 7 >> 3; uVar14 = uVar14 + 1) {
            bVar1 = puVar18[uVar14];
            iVar7 = (int)pFVar16;
            uVar9 = iVar7 + 8;
            lVar5 = 0;
            iVar6 = 7;
            do {
              if (iVar6 == -1) goto LAB_0010445d;
              *(char *)(lVar12 + lVar5) =
                   (char)((0x80U >> ((byte)lVar5 & 0x1f) & (uint)bVar1) >> ((byte)iVar6 & 0x1f));
              iVar6 = iVar6 + -1;
              lVar5 = lVar5 + 1;
              uVar15 = bmp_width;
            } while (iVar7 + (int)lVar5 != bmp_width);
            uVar15 = iVar7 + (int)lVar5;
            uVar9 = uVar15;
LAB_0010445d:
            pFVar10 = (FILE *)(ulong)uVar9;
            lVar12 = lVar12 + lVar5;
            pFVar16 = pFVar10;
          }
          puVar11 = (uint8_t *)(lVar12 - (ulong)uVar15);
          puVar18 = puVar18 + bytesPerLine;
        }
      }
      puVar18 = bmp_dst_buf;
      uVar14 = (ulong)(ushort)InfoHead.ciWidth;
      local_a8 = bmp_dst_buf + 1;
      pbVar21 = bmp_dst_buf + 2;
      uVar17 = 2;
      uVar8 = 0;
      local_d0 = bmp_dst_buf;
      local_bc = y;
      uVar15 = x;
      do {
        if (uVar8 == (ushort)InfoHead.ciHeight) {
          fclose(__stream);
          return '\0';
        }
        pbVar20 = pbVar21;
        uVar9 = uVar17;
        for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
          if ((bmp_BitCount == '\x01') || (bmp_BitCount == '\x04')) {
LAB_001047c9:
            bVar1 = local_d0[uVar19];
            pFVar10 = (FILE *)(ulong)palette[bVar1].red;
            uVar15 = (uint32_t)palette[bVar1].blue;
            sVar3 = (size_t)palette[bVar1].green;
          }
          else if (bmp_BitCount == ' ') {
            pFVar10 = (FILE *)(ulong)puVar18[uVar9 - 2];
            sVar3 = (size_t)puVar18[uVar9 - 1];
            uVar15 = (uint32_t)puVar18[uVar9];
          }
          else if (bmp_BitCount == '\x10') {
            pFVar10 = (FILE *)(ulong)(local_a8[uVar19 * 2 + -1] * '\x02' & 0xf8);
            sVar3 = (size_t)(byte)(local_a8[uVar19 * 2] >> 2 & 0x38 | local_a8[uVar19 * 2 + -1] << 6
                                  );
            uVar15 = (uint32_t)(byte)(local_a8[uVar19 * 2] << 3);
          }
          else if (bmp_BitCount == '\x18') {
            pFVar10 = (FILE *)(ulong)pbVar20[-2];
            sVar3 = (size_t)pbVar20[-1];
            uVar15 = (uint32_t)*pbVar20;
          }
          else if (bmp_BitCount == '\b') goto LAB_001047c9;
          EPD_DrawPixel((short)x + (short)uVar19,(uint16_t)local_bc,
                        (uint8_t)((ulong)((uVar15 & 0xff) * 0x72 +
                                          ((uint)sVar3 & 0xff) * 0x24b +
                                          ((uint)pFVar10 & 0xff) * 299 + 500) / 1000));
          pbVar20 = pbVar20 + 3;
          uVar9 = uVar9 + 4;
        }
        uVar8 = uVar8 + 1;
        local_bc = local_bc + 1;
        local_d0 = local_d0 + uVar14;
        local_a8 = local_a8 + ((uint)(ushort)InfoHead.ciWidth + (uint)(ushort)InfoHead.ciWidth);
        pbVar21 = pbVar21 + uVar14 * 3;
        uVar17 = uVar17 + (uint)(ushort)InfoHead.ciWidth * 4;
      } while( true );
    }
  }
  __s = "Load > malloc bmp out of memory!";
LAB_00104340:
  puts(__s);
  return 0xfb;
}

Assistant:

uint8_t Show_bmp(uint32_t x, uint32_t y,char *path)
{
	FILE *fp;//bmp�ļ�ָ��
	BITMAPFILEHEADER FileHead;
	BITMAPINFOHEADER InfoHead;
	uint32_t total_length;
	uint8_t *buf = NULL;
	uint32_t ret = -1;
	 
	fp = fopen(path,"rb");
	if (fp == NULL)
	{
		return(-1);
	}
 
	ret = fread(&FileHead, sizeof(BITMAPFILEHEADER),1, fp);
	if (ret != 1)
	{
		printf("Read header error!\n");
		fclose(fp);
		return(-2);
	}

	//�����Ƿ���bmpͼ��
	if (FileHead.cfType != 0x4D42)//�ļ����ͣ�"BM"(0x4D42)
	{
		printf("It's not a BMP file\n");
		fclose(fp);
		return(-3);
	}
	
	printf("\n*****************************************\n");
	printf("BMP_cfSize:%d \n", FileHead.cfSize);
 	printf("BMP_cfoffBits:%d \n", FileHead.cfoffBits);
	
	ret = fread((char *)&InfoHead, sizeof(BITMAPINFOHEADER),1, fp);
	if (ret != 1)
	{
		printf("Read infoheader error!\n");
		fclose(fp);
		return(-4);
	}
	
	printf("BMP_ciSize:%d \n", InfoHead.ciSize);
 	printf("BMP_ciWidth:%d \n", InfoHead.ciWidth);
	printf("BMP_ciHeight:%d \n", InfoHead.ciHeight);
	printf("BMP_ciPlanes:%x \n", InfoHead.ciPlanes);
	printf("BMP_ciBitCount:%x \n", InfoHead.ciBitCount);
	printf("BMP_ciCompress:%x \n", InfoHead.ciCompress);
	printf("BMP_ciSizeImage:%x \n", InfoHead.ciSizeImage);
	printf("BMP_ciXPelsPerMeter:%x \n", InfoHead.ciXPelsPerMeter);
	printf("BMP_ciYPelsPerMeter:%x \n", InfoHead.ciYPelsPerMeter);
	printf("BMP_ciClrUsed:%x \n", InfoHead.ciClrUsed);
	printf("BMP_ciClrImportant:%x \n", InfoHead.ciClrImportant);
 	printf("*****************************************\n\n");
	
	total_length = FileHead.cfSize-FileHead.cfoffBits;
	bytesPerLine=((InfoHead.ciWidth*InfoHead.ciBitCount+31)>>5)<<2;
	imageSize=bytesPerLine*InfoHead.ciHeight;
	skip=(4-((InfoHead.ciWidth*InfoHead.ciBitCount)>>3))&3;
	
	printf("total_length:%d,%d\n", InfoHead.ciSizeImage,FileHead.cfSize-FileHead.cfoffBits);
	printf("bytesPerLine = %d\n", bytesPerLine);
	printf("imageSize = %d\n", imageSize);
	printf("skip = %d\n", skip);
	
    bmp_width = InfoHead.ciWidth;
    bmp_height = InfoHead.ciHeight;
	bmp_BitCount = InfoHead.ciBitCount;
	
    bmp_src_buf = (uint8_t*)calloc(1,total_length);
    if(bmp_src_buf == NULL){
        printf("Load > malloc bmp out of memory!\n");
        return -5;
    }
	
	bmp_dst_buf = (uint8_t*)calloc(1,total_length);
    if(bmp_dst_buf == NULL){
        printf("Load > malloc bmp out of memory!\n");
        return -5;
    }

	 //��ת��������
    fseek(fp, FileHead.cfoffBits, SEEK_SET);
	
	//ÿ���ֽ���
    buf = bmp_src_buf;
    while ((ret = fread(buf,1,total_length,fp)) >= 0) 
	{
        if (ret == 0) 
		{
            usleep(100);
            continue;
        }
		buf = ((uint8_t*)buf) + ret;
        total_length = total_length - ret;
        if(total_length == 0)
            break;
    }
	
	//��ת�����԰�
	switch(bmp_BitCount)
	{	
		case 1:
			fseek(fp, 54, SEEK_SET);
			ret = fread(palette,1,4*2,fp);
			if (ret != 8) 
			{
				printf("Error: fread != 8\n");
				return -5;
			}
		
			bmp_dst_buf = (uint8_t*)calloc(1,InfoHead.ciWidth * InfoHead.ciHeight);
			if(bmp_dst_buf == NULL)
			{
				printf("Load > malloc bmp out of memory!\n");
				return -5;
			}
		break;
		
		case 4:
			fseek(fp, 54, SEEK_SET);
			ret = fread(palette,1,4*16,fp);
			if (ret != 64) 
			{
				printf("Error: fread != 64\n");
				return -5;
			}
		
			bmp_dst_buf = (uint8_t*)calloc(1,InfoHead.ciWidth * InfoHead.ciHeight);
			if(bmp_dst_buf == NULL)
			{
				printf("Load > malloc bmp out of memory!\n");
				return -5;
			}
		break;
		
		case 8:
			fseek(fp, 54, SEEK_SET);

			ret = fread(palette,1,4*256,fp);

			if (ret != 1024) 
			{
				printf("Error: fread != 1024\n");
				return -5;
			}
		break;
		
		default:
		break;
	}

	Bitmap_format_Matrix(bmp_dst_buf,bmp_src_buf);
	DrawMatrix(x, y,InfoHead.ciWidth, InfoHead.ciHeight, bmp_dst_buf);

	fclose(fp);
	return(0);
}